

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccmake.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  long lVar6;
  ostream *poVar7;
  cmCursesMainForm *pcVar8;
  char *pcVar9;
  void *this;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar10;
  int local_6a4;
  int local_67c;
  uint local_630;
  uint local_62c;
  anon_class_8_1_61fd55ae local_5e0;
  MessageCallback local_5d8;
  undefined1 local_5b1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5b0;
  cmCursesMainForm *local_598;
  cmCursesMainForm *myform;
  int y;
  int x;
  string local_568 [8];
  string arg;
  string cacheDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  uint local_508;
  int j;
  uint i;
  bool debug;
  string local_4f8;
  undefined1 local_4d8 [8];
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> generators;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  undefined1 local_470 [8];
  cmake hcm;
  cmDocumentation doc;
  undefined1 local_30 [8];
  CommandLineArguments encoding_args;
  char **argv_local;
  int argc_local;
  
  encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = argv;
  cmSystemTools::EnsureStdPipes();
  cmsys::Encoding::CommandLineArguments::Main
            ((CommandLineArguments *)local_30,argc,
             encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  iVar2 = cmsys::Encoding::CommandLineArguments::argc((CommandLineArguments *)local_30);
  encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       cmsys::Encoding::CommandLineArguments::argv((CommandLineArguments *)local_30);
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources
            (*encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cmDocumentation::cmDocumentation((cmDocumentation *)&hcm.MessageLogLevel);
  cmDocumentation::addCMakeStandardDocSections((cmDocumentation *)&hcm.MessageLogLevel);
  bVar1 = cmDocumentation::CheckOptions
                    ((cmDocumentation *)&hcm.MessageLogLevel,iVar2,
                     encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage,(char *)0x0);
  if (bVar1) {
    cmake::cmake((cmake *)local_470,RoleInternal,Unknown);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"",&local_491);
    cmake::SetHomeDirectory((cmake *)local_470,&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator(&local_491);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b8,"",
               (allocator<char> *)
               ((long)&generators.
                       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmake::SetHomeOutputDirectory((cmake *)local_470,&local_4b8);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&generators.
                       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmake::AddCMakePaths((cmake *)local_470);
    cmake::GetGeneratorsDocumentation
              ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_4d8,
               (cmake *)local_470);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f8,"ccmake",(allocator<char> *)&debug);
    cmDocumentation::SetName((cmDocumentation *)&hcm.MessageLogLevel,&local_4f8);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::allocator<char>::~allocator((allocator<char> *)&debug);
    cmDocumentation::SetSection((cmDocumentation *)&hcm.MessageLogLevel,"Name",cmDocumentationName);
    cmDocumentation::SetSection
              ((cmDocumentation *)&hcm.MessageLogLevel,"Usage",cmDocumentationUsage);
    if (iVar2 == 1) {
      cmDocumentation::AppendSection
                ((cmDocumentation *)&hcm.MessageLogLevel,"Usage",cmDocumentationUsageNote);
    }
    cmDocumentation::AppendSection
              ((cmDocumentation *)&hcm.MessageLogLevel,"Generators",
               (vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_4d8);
    cmDocumentation::PrependSection
              ((cmDocumentation *)&hcm.MessageLogLevel,"Options",cmDocumentationOptions);
    bVar1 = cmDocumentation::PrintRequestedDocumentation
                      ((cmDocumentation *)&hcm.MessageLogLevel,(ostream *)&std::cout);
    argv_local._4_4_ = (uint)!bVar1;
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
              ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_4d8);
    cmake::~cmake((cmake *)local_470);
  }
  else {
    bVar1 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&cacheDir.field_2 + 8));
    uVar10 = extraout_RDX;
    for (args.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < iVar2;
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      iVar3 = strcmp(encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage
                     [args.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],"-debug");
      if (iVar3 == 0) {
        bVar1 = true;
        uVar10 = extraout_RDX_00;
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (cacheDir.field_2._M_local_buf + 8),
                   encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage +
                   args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        uVar10 = extraout_RDX_01;
      }
    }
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)((long)&arg.field_2 + 8),(SystemTools *)0x1,SUB81(uVar10,0));
    for (local_508 = 1;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&cacheDir.field_2 + 8)), local_508 < sVar4;
        local_508 = local_508 + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&cacheDir.field_2 + 8),(ulong)local_508);
      std::__cxx11::string::string(local_568,(string *)pvVar5);
      lVar6 = std::__cxx11::string::find((char *)local_568,0x817cad);
      if (lVar6 == 0) {
        std::__cxx11::string::substr((ulong)&y,(ulong)local_568);
        std::__cxx11::string::operator=((string *)(arg.field_2._M_local_buf + 8),(string *)&y);
        std::__cxx11::string::~string((string *)&y);
      }
      std::__cxx11::string::~string(local_568);
    }
    cmSystemTools::DisableRunCommandOutput();
    if (bVar1) {
      cmCursesForm::DebugStart();
    }
    initscr();
    noecho();
    cbreak();
    keypad(_stdscr,1);
    signal(0x1c,onsig);
    if (_stdscr == 0) {
      local_62c = 0xffffffff;
    }
    else {
      local_62c = (int)*(short *)(_stdscr + 4) + 1;
    }
    myform._0_4_ = local_62c;
    if (_stdscr == 0) {
      local_630 = 0xffffffff;
    }
    else {
      local_630 = (int)*(short *)(_stdscr + 6) + 1;
    }
    myform._4_4_ = local_630;
    if (((int)local_630 < 0x41) || ((int)local_62c < 6)) {
      endwin();
      poVar7 = std::operator<<((ostream *)&std::cerr,"Window is too small. A size of at least ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x41);
      poVar7 = std::operator<<(poVar7," x ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,6);
      poVar7 = std::operator<<(poVar7," is required to run ccmake.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
    }
    else {
      pcVar8 = (cmCursesMainForm *)operator_new(0x110);
      local_5b1 = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_5b0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&cacheDir.field_2 + 8));
      cmCursesMainForm::cmCursesMainForm(pcVar8,&local_5b0,myform._4_4_);
      local_5b1 = 0;
      local_598 = pcVar8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_5b0);
      pcVar8 = local_598;
      pcVar9 = (char *)std::__cxx11::string::c_str();
      iVar2 = cmCursesMainForm::LoadCache(pcVar8,pcVar9);
      if (iVar2 == 0) {
        local_5e0.myform = local_598;
        std::function<void(std::__cxx11::string_const&,char_const*)>::function<main::__0,void>
                  ((function<void(std::__cxx11::string_const&,char_const*)> *)&local_5d8,&local_5e0)
        ;
        cmSystemTools::SetMessageCallback(&local_5d8);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*)>
        ::~function(&local_5d8);
        cmCursesForm::CurrentForm = &local_598->super_cmCursesForm;
        cmCursesMainForm::InitializeUI(local_598);
        iVar2 = cmCursesMainForm::Configure(local_598,1);
        if (iVar2 == 0) {
          (*(local_598->super_cmCursesForm)._vptr_cmCursesForm[3])
                    (local_598,1,1,(ulong)myform._4_4_,(ulong)(uint)myform);
          (*(local_598->super_cmCursesForm)._vptr_cmCursesForm[2])();
        }
        curses_clear();
        if (_stdscr == 0) {
          local_6a4 = -1;
        }
        else {
          local_6a4 = *(short *)(_stdscr + 4) + 1;
        }
        wtouchln(_stdscr,0,local_6a4,1);
        endwin();
        if (cmCursesForm::CurrentForm != (cmCursesForm *)0x0) {
          (*cmCursesForm::CurrentForm->_vptr_cmCursesForm[1])();
        }
        cmCursesForm::CurrentForm = (cmCursesForm *)0x0;
        this = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 0;
      }
      else {
        curses_clear();
        if (_stdscr == 0) {
          local_67c = -1;
        }
        else {
          local_67c = *(short *)(_stdscr + 4) + 1;
        }
        wtouchln(_stdscr,0,local_67c,1);
        endwin();
        if (local_598 != (cmCursesMainForm *)0x0) {
          (*(local_598->super_cmCursesForm)._vptr_cmCursesForm[1])();
        }
        std::operator<<((ostream *)&std::cerr,"Error running cmake::LoadCache().  Aborting.\n");
        argv_local._4_4_ = 1;
      }
    }
    std::__cxx11::string::~string((string *)(arg.field_2._M_local_buf + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&cacheDir.field_2 + 8));
  }
  cmDocumentation::~cmDocumentation((cmDocumentation *)&hcm.MessageLogLevel);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)local_30);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char const* const* argv)
{
  cmSystemTools::EnsureStdPipes();
  cmsys::Encoding::CommandLineArguments encoding_args =
    cmsys::Encoding::CommandLineArguments::Main(argc, argv);
  argc = encoding_args.argc();
  argv = encoding_args.argv();

  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(argv[0]);
  cmDocumentation doc;
  doc.addCMakeStandardDocSections();
  if (doc.CheckOptions(argc, argv)) {
    cmake hcm(cmake::RoleInternal, cmState::Unknown);
    hcm.SetHomeDirectory("");
    hcm.SetHomeOutputDirectory("");
    hcm.AddCMakePaths();
    auto generators = hcm.GetGeneratorsDocumentation();
    doc.SetName("ccmake");
    doc.SetSection("Name", cmDocumentationName);
    doc.SetSection("Usage", cmDocumentationUsage);
    if (argc == 1) {
      doc.AppendSection("Usage", cmDocumentationUsageNote);
    }
    doc.AppendSection("Generators", generators);
    doc.PrependSection("Options", cmDocumentationOptions);
    return doc.PrintRequestedDocumentation(std::cout) ? 0 : 1;
  }

  bool debug = false;
  unsigned int i;
  int j;
  std::vector<std::string> args;
  for (j = 0; j < argc; ++j) {
    if (strcmp(argv[j], "-debug") == 0) {
      debug = true;
    } else {
      args.emplace_back(argv[j]);
    }
  }

  std::string cacheDir = cmSystemTools::GetCurrentWorkingDirectory();
  for (i = 1; i < args.size(); ++i) {
    std::string arg = args[i];
    if (arg.find("-B", 0) == 0) {
      cacheDir = arg.substr(2);
    }
  }

  cmSystemTools::DisableRunCommandOutput();

  if (debug) {
    cmCursesForm::DebugStart();
  }

  initscr();            /* Initialization */
  noecho();             /* Echo off */
  cbreak();             /* nl- or cr not needed */
  keypad(stdscr, true); /* Use key symbols as KEY_DOWN */

  signal(SIGWINCH, onsig);

  int x, y;
  getmaxyx(stdscr, y, x);
  if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
    endwin();
    std::cerr << "Window is too small. A size of at least "
              << cmCursesMainForm::MIN_WIDTH << " x "
              << cmCursesMainForm::MIN_HEIGHT << " is required to run ccmake."
              << std::endl;
    return 1;
  }

  cmCursesMainForm* myform;

  myform = new cmCursesMainForm(args, x);
  if (myform->LoadCache(cacheDir.c_str())) {
    curses_clear();
    touchwin(stdscr);
    endwin();
    delete myform;
    std::cerr << "Error running cmake::LoadCache().  Aborting.\n";
    return 1;
  }

  cmSystemTools::SetMessageCallback(
    [myform](const std::string& message, const char* title) {
      myform->AddError(message, title);
    });

  cmCursesForm::CurrentForm = myform;

  myform->InitializeUI();
  if (myform->Configure(1) == 0) {
    myform->Render(1, 1, x, y);
    myform->HandleInput();
  }

  // Need to clean-up better
  curses_clear();
  touchwin(stdscr);
  endwin();
  delete cmCursesForm::CurrentForm;
  cmCursesForm::CurrentForm = nullptr;

  std::cout << std::endl << std::endl;

  return 0;
}